

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O3

void pnga_print_patch_file2d
               (FILE *file,Integer g_a,Integer ilo,Integer ihi,Integer jlo,Integer jhi,
               Integer pretty)

{
  Integer grp_id;
  Integer IVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  Integer ld;
  Integer hi [2];
  Integer lo [2];
  long local_168;
  long local_150;
  Integer type;
  long local_130;
  DoublePrecision dbuf [6];
  char *name;
  int ibuf [6];
  float fbuf [6];
  Integer ndim;
  longlong llbuf [6];
  long lbuf [6];
  Integer dims [2];
  
  ld = 1;
  grp_id = pnga_get_pgroup(g_a);
  pnga_pgroup_sync(grp_id);
  pnga_check_handle(g_a,"ga_print");
  IVar1 = pnga_pgroup_nodeid(grp_id);
  if (IVar1 == 0) {
    pnga_inquire(g_a,&type,&ndim,dims);
    pnga_inquire_name(g_a,&name);
    if ((((ilo < 1) || (jlo < 1)) || (dims[0] < ihi)) || (dims[1] < jhi)) {
      fprintf(_stderr,"%ld %ld %ld %ld dims: [%ld,%ld]\n",ilo,ihi,jlo,jhi,dims[0],dims[1]);
      pnga_error(" ga_print: indices out of range ",g_a);
    }
    fprintf((FILE *)file,"\n global array: %s[%ld:%ld,%ld:%ld],  handle: %d \n",name,ilo,ihi,jlo,jhi
            ,g_a);
    lVar2 = (ulong)(type != 0x3ee) * 3 + 3;
    if (pretty == 0) {
      if (ilo <= ihi) {
        local_130 = lVar2 + jlo + -1;
        do {
          lVar5 = 1 - jlo;
          lVar6 = jlo;
          lVar3 = local_130;
          if (jlo <= jhi) {
            do {
              lVar7 = lVar3;
              if (jhi < lVar3) {
                lVar7 = jhi;
              }
              lVar4 = lVar2 + lVar6 + -1;
              if (jhi <= lVar4) {
                lVar4 = jhi;
              }
              hi[0] = ilo;
              hi[1] = lVar4;
              lo[0] = ilo;
              lo[1] = lVar6;
              if (type - 0x3e9U < 0x10) {
                lVar7 = lVar7 + lVar5;
                switch(type) {
                case 0x3e9:
                  pnga_get(g_a,lo,hi,ibuf,&ld);
                  if (lVar6 <= lVar4) {
                    lVar4 = 0;
                    do {
                      fprintf((FILE *)file," %8d",(ulong)(uint)ibuf[lVar4]);
                      lVar4 = lVar4 + 1;
                    } while (lVar7 != lVar4);
                  }
                  break;
                case 0x3ea:
                  pnga_get(g_a,lo,hi,lbuf,&ld);
                  if (lVar6 <= lVar4) {
                    lVar4 = 0;
                    do {
                      fprintf((FILE *)file," %8ld",lbuf[lVar4]);
                      lVar4 = lVar4 + 1;
                    } while (lVar7 != lVar4);
                  }
                  break;
                case 0x3eb:
                  pnga_get(g_a,lo,hi,fbuf,&ld);
                  if (lVar6 <= lVar4) {
                    lVar4 = 0;
                    do {
                      fprintf((FILE *)file," %11.5f",(double)fbuf[lVar4]);
                      lVar4 = lVar4 + 1;
                    } while (lVar7 != lVar4);
                  }
                  break;
                case 0x3ec:
                  pnga_get(g_a,lo,hi,dbuf,&ld);
                  if (lVar6 <= lVar4) {
                    lVar4 = 0;
                    do {
                      fprintf((FILE *)file," %11.5f",dbuf[lVar4]);
                      lVar4 = lVar4 + 1;
                    } while (lVar7 != lVar4);
                  }
                  break;
                default:
                  goto switchD_001b63e6_caseD_3ed;
                case 0x3ee:
                  pnga_get(g_a,lo,hi,dbuf,&ld);
                  if (-1 < lVar4 - lVar6) {
                    lVar7 = 0;
                    do {
                      fprintf((FILE *)file," %11.5f,%11.5f",dbuf[lVar7],dbuf[lVar7 + 1]);
                      lVar7 = lVar7 + 2;
                    } while (lVar7 <= lVar4 - lVar6);
                  }
                  break;
                case 0x3ef:
                  pnga_get(g_a,lo,hi,dbuf,&ld);
                  if (-1 < lVar4 - lVar6) {
                    lVar7 = 0;
                    do {
                      fprintf((FILE *)file," %11.5f,%11.5f",dbuf[lVar7],dbuf[lVar7 + 1]);
                      lVar7 = lVar7 + 2;
                    } while (lVar7 <= lVar4 - lVar6);
                  }
                  break;
                case 0x3f8:
                  pnga_get(g_a,lo,hi,llbuf,&ld);
                  if (lVar6 <= lVar4) {
                    lVar4 = 0;
                    do {
                      fprintf((FILE *)file," %8lld",llbuf[lVar4]);
                      lVar4 = lVar4 + 1;
                    } while (lVar7 != lVar4);
                  }
                }
              }
              else {
switchD_001b63e6_caseD_3ed:
                pnga_error("ga_print: wrong type",0);
              }
              lVar6 = lVar6 + lVar2;
              lVar5 = lVar5 - lVar2;
              lVar3 = lVar3 + lVar2;
            } while (lVar6 <= jhi);
          }
          fputc(10,(FILE *)file);
          bVar8 = ilo != ihi;
          ilo = ilo + 1;
        } while (bVar8);
      }
      fflush((FILE *)file);
    }
    else if (jlo <= jhi) {
      lVar5 = jlo + lVar2 + -1;
      local_150 = 1 - jlo;
      local_168 = jlo + -1;
      do {
        lVar6 = lVar5;
        if (jhi < lVar5) {
          lVar6 = jhi;
        }
        lVar3 = jlo + lVar2 + -1;
        if (jhi <= lVar3) {
          lVar3 = jhi;
        }
        local_130 = lVar5;
        fputc(10,(FILE *)file);
        fputc(10,(FILE *)file);
        fwrite("      ",6,1,(FILE *)file);
        switch(type) {
        case 0x3e9:
          lVar5 = jlo;
          if (jlo <= lVar3) {
            do {
              fprintf((FILE *)file,"%6ld  ",lVar5);
              bVar8 = lVar5 < lVar3;
              lVar5 = lVar5 + 1;
            } while (bVar8);
            fwrite("\n      ",7,1,(FILE *)file);
            lVar5 = local_168;
            if (jlo <= lVar3) {
              do {
                fwrite(" -------",8,1,(FILE *)file);
                lVar5 = lVar5 + 1;
              } while (lVar5 < lVar3);
            }
            break;
          }
          goto LAB_001b5eec;
        case 0x3ea:
          lVar5 = jlo;
          if (lVar3 < jlo) goto LAB_001b5eec;
          do {
            fprintf((FILE *)file,"%6ld  ",lVar5);
            bVar8 = lVar5 < lVar3;
            lVar5 = lVar5 + 1;
          } while (bVar8);
          fwrite("\n      ",7,1,(FILE *)file);
          lVar5 = local_168;
          if (jlo <= lVar3) {
            do {
              fwrite(" -------",8,1,(FILE *)file);
              lVar5 = lVar5 + 1;
            } while (lVar5 < lVar3);
          }
          break;
        case 0x3ec:
          lVar5 = jlo;
          if (lVar3 < jlo) {
            fwrite("\n      ",7,1,(FILE *)file);
          }
          else {
            do {
              fprintf((FILE *)file,"%8ld    ",lVar5);
              bVar8 = lVar5 < lVar3;
              lVar5 = lVar5 + 1;
            } while (bVar8);
            fwrite("\n      ",7,1,(FILE *)file);
            lVar5 = local_168;
            if (jlo <= lVar3) {
              do {
                fwrite(" -----------",0xc,1,(FILE *)file);
                lVar5 = lVar5 + 1;
              } while (lVar5 < lVar3);
            }
          }
        case 0x3eb:
          lVar5 = jlo;
          if (lVar3 < jlo) {
LAB_001b5eec:
            fwrite("\n      ",7,1,(FILE *)file);
          }
          else {
            do {
              fprintf((FILE *)file,"%8ld    ",lVar5);
              bVar8 = lVar5 < lVar3;
              lVar5 = lVar5 + 1;
            } while (bVar8);
            fwrite("\n      ",7,1,(FILE *)file);
            lVar5 = local_168;
            if (jlo <= lVar3) {
              do {
                fwrite(" -----------",0xc,1,(FILE *)file);
                lVar5 = lVar5 + 1;
              } while (lVar5 < lVar3);
            }
          }
          break;
        case 0x3ee:
          lVar5 = jlo;
          if (jlo <= lVar3) {
            do {
              fprintf((FILE *)file,"%20ld    ",lVar5);
              bVar8 = lVar5 < lVar3;
              lVar5 = lVar5 + 1;
            } while (bVar8);
          }
          fwrite("\n      ",7,1,(FILE *)file);
          lVar5 = lVar3 * 2;
          lVar7 = local_168;
          if (jlo == lVar5 || SBORROW8(jlo,lVar5) != jlo + lVar3 * -2 < 0) {
            do {
              fwrite(" -----------",0xc,1,(FILE *)file);
              lVar7 = lVar7 + 1;
            } while (SBORROW8(lVar7,lVar5) != lVar7 + lVar3 * -2 < 0);
          }
          break;
        case 0x3ef:
          lVar5 = jlo;
          if (jlo <= lVar3) {
            do {
              fprintf((FILE *)file,"%20ld    ",lVar5);
              bVar8 = lVar5 < lVar3;
              lVar5 = lVar5 + 1;
            } while (bVar8);
          }
          fwrite("\n      ",7,1,(FILE *)file);
          lVar5 = lVar3 * 2;
          lVar7 = local_168;
          if (jlo == lVar5 || SBORROW8(jlo,lVar5) != jlo + lVar3 * -2 < 0) {
            do {
              fwrite(" -----------",0xc,1,(FILE *)file);
              lVar7 = lVar7 + 1;
            } while (SBORROW8(lVar7,lVar5) != lVar7 + lVar3 * -2 < 0);
          }
          break;
        case 0x3f8:
          lVar5 = jlo;
          if (lVar3 < jlo) goto LAB_001b5eec;
          do {
            fprintf((FILE *)file,"%6ld  ",lVar5);
            bVar8 = lVar5 < lVar3;
            lVar5 = lVar5 + 1;
          } while (bVar8);
          fwrite("\n      ",7,1,(FILE *)file);
          lVar5 = local_168;
          if (jlo <= lVar3) {
            do {
              fwrite(" -------",8,1,(FILE *)file);
              lVar5 = lVar5 + 1;
            } while (lVar5 < lVar3);
          }
        }
        fputc(10,(FILE *)file);
        if (ilo <= ihi) {
          lVar6 = lVar6 + local_150;
          lVar5 = lVar3 - jlo;
          IVar1 = ilo;
          do {
            fprintf((FILE *)file,"%4ld  ",IVar1);
            hi[0] = jlo;
            hi[1] = lVar3;
            lo[0] = IVar1;
            lo[1] = IVar1;
            switch(type) {
            case 0x3e9:
              pnga_get(g_a,lo,hi,ibuf,&ld);
              if (-1 < lVar5) {
                lVar7 = 0;
                do {
                  fprintf((FILE *)file," %8d",(ulong)(uint)ibuf[lVar7]);
                  lVar7 = lVar7 + 1;
                } while (lVar6 != lVar7);
              }
              break;
            case 0x3ea:
              pnga_get(g_a,lo,hi,lbuf,&ld);
              if (-1 < lVar5) {
                lVar7 = 0;
                do {
                  fprintf((FILE *)file," %8ld",lbuf[lVar7]);
                  lVar7 = lVar7 + 1;
                } while (lVar6 != lVar7);
              }
              break;
            case 0x3eb:
              pnga_get(g_a,lo,hi,dbuf,&ld);
              if (-1 < lVar5) {
                lVar7 = 0;
                do {
                  fprintf((FILE *)file," %11.5f",(double)fbuf[lVar7]);
                  lVar7 = lVar7 + 1;
                } while (lVar6 != lVar7);
              }
              break;
            case 0x3ec:
              pnga_get(g_a,lo,hi,dbuf,&ld);
              if (-1 < lVar5) {
                lVar7 = 0;
                do {
                  fprintf((FILE *)file," %11.5f",dbuf[lVar7]);
                  lVar7 = lVar7 + 1;
                } while (lVar6 != lVar7);
              }
              break;
            default:
              pnga_error("ga_print: wrong type",0);
              break;
            case 0x3ee:
              pnga_get(g_a,lo,hi,dbuf,&ld);
              if (-1 < lVar5) {
                lVar7 = 0;
                do {
                  fprintf((FILE *)file," %11.5f,%11.5f",dbuf[lVar7],dbuf[lVar7 + 1]);
                  lVar7 = lVar7 + 2;
                } while (lVar7 <= lVar5);
              }
              break;
            case 0x3ef:
              pnga_get(g_a,lo,hi,dbuf,&ld);
              if (-1 < lVar5) {
                lVar7 = 0;
                do {
                  fprintf((FILE *)file," %11.5f,%11.5f",dbuf[lVar7],dbuf[lVar7 + 1]);
                  lVar7 = lVar7 + 2;
                } while (lVar7 <= lVar5);
              }
              break;
            case 0x3f8:
              pnga_get(g_a,lo,hi,llbuf,&ld);
              if (-1 < lVar5) {
                lVar7 = 0;
                do {
                  fprintf((FILE *)file," %8lld",llbuf[lVar7]);
                  lVar7 = lVar7 + 1;
                } while (lVar6 != lVar7);
              }
            }
            fputc(10,(FILE *)file);
            bVar8 = IVar1 != ihi;
            IVar1 = IVar1 + 1;
          } while (bVar8);
        }
        jlo = jlo + lVar2;
        fflush((FILE *)file);
        lVar5 = local_130 + lVar2;
        local_150 = local_150 - lVar2;
        local_168 = local_168 + lVar2;
      } while (jlo <= jhi);
    }
  }
  pnga_pgroup_sync(grp_id);
  return;
}

Assistant:

void pnga_print_patch_file2d(file, g_a, ilo, ihi, jlo, jhi, pretty)
        FILE *file;
        Integer g_a, ilo, ihi, jlo, jhi, pretty;
/*
  Pretty = 0 ... spew output out with no formatting
  Pretty = 1 ... format output so that it is readable
*/  
{
#define BUFSIZE 6
#define FLEN 80 
  Integer i, j,jj, dim1, dim2, type, jmax, ld=1, bufsize ;
  Integer a_grp;
  int ibuf[BUFSIZE];
  DoublePrecision  dbuf[BUFSIZE];
  float fbuf[BUFSIZE]; 
  long lbuf[BUFSIZE]; 
  long long llbuf[BUFSIZE]; 
  char *name;
  Integer ndim, dims[2];
  Integer lo[2], hi[2];

  a_grp = pnga_get_pgroup(g_a);
  pnga_pgroup_sync(a_grp);
  pnga_check_handle(g_a, "ga_print");
  if(pnga_pgroup_nodeid(a_grp) == 0){

    pnga_inquire(g_a, &type, &ndim, dims);
    dim1 = dims[0];
    dim2 = dims[1];
    /*     name[FLEN-1]='\0';*/
    pnga_inquire_name(g_a, &name);
    if (ilo <= 0 || ihi > dim1 || jlo <= 0 || jhi > dim2){
      fprintf(stderr,"%ld %ld %ld %ld dims: [%ld,%ld]\n", 
          (long)ilo,(long)ihi, (long)jlo,(long)jhi,
          (long)dim1, (long)dim2);
      pnga_error(" ga_print: indices out of range ", g_a);
    }

    fprintf(file,"\n global array: %s[%ld:%ld,%ld:%ld],  handle: %d \n",
        name, (long)ilo, (long)ihi, (long)jlo, (long)jhi, (int)g_a);

    bufsize = (type==C_DCPL)? BUFSIZE/2 : BUFSIZE;
    bufsize = (type==C_SCPL)? BUFSIZE/2 : BUFSIZE;


    if (!pretty) {
      for (i=ilo; i <ihi+1; i++){
        for (j=jlo; j <jhi+1; j+=bufsize){
          jmax = GA_MIN(j+bufsize-1,jhi);
          lo[0] = i;
          lo[1] = j;
          hi[0] = i;
          hi[1] = jmax;
          switch(type){
            case C_INT:
              pnga_get(g_a, lo, hi, ibuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %8d",ibuf[jj]);
              break;
            case C_DBL:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %11.5f",dbuf[jj]);
              break;
            case C_DCPL:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj+=2)
                fprintf(file," %11.5f,%11.5f",dbuf[jj], dbuf[jj+1]);
              break;
            case C_SCPL:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj+=2)
                fprintf(file," %11.5f,%11.5f",dbuf[jj], dbuf[jj+1]);
              break;
            case C_FLOAT:
              pnga_get(g_a, lo, hi, fbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %11.5f",fbuf[jj]);
              break;       
            case C_LONG:
              pnga_get(g_a, lo, hi, lbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %8ld",lbuf[jj]);
              break;
            case C_LONGLONG:
              pnga_get(g_a, lo, hi, llbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %8lld",llbuf[jj]);
              break;
            default: pnga_error("ga_print: wrong type",0);
          }
        }
        fprintf(file,"\n");
      }
      fflush(file);

    } else {

      for (j=jlo; j<jhi+1; j+=bufsize){
        jmax = GA_MIN(j+bufsize-1,jhi);

        fprintf(file, "\n"); fprintf(file, "\n");

        /* Print out column headers */

        fprintf(file, "      ");
        switch(type){
          case C_INT:
            for (jj=j; jj<=jmax; jj++) fprintf(file, "%6ld  ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=jmax; jj++) fprintf(file," -------");
            break;
          case C_LONG:  
            for (jj=j; jj<=jmax; jj++) fprintf(file, "%6ld  ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=jmax; jj++) fprintf(file," -------");
            break;
          case C_LONGLONG:  
            for (jj=j; jj<=jmax; jj++) fprintf(file, "%6ld  ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=jmax; jj++) fprintf(file," -------");
            break;
          case C_DCPL:
            for (jj=j; jj<=jmax; jj++) fprintf(file,"%20ld    ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=2*jmax; jj++) fprintf(file," -----------");
            break;
          case C_SCPL:
            for (jj=j; jj<=jmax; jj++) fprintf(file,"%20ld    ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=2*jmax; jj++) fprintf(file," -----------");
            break;
          case C_DBL:
            for (jj=j; jj<=jmax; jj++) fprintf(file,"%8ld    ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=jmax; jj++) fprintf(file," -----------");         
          case C_FLOAT:
            for (jj=j; jj<=jmax; jj++) fprintf(file,"%8ld    ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=jmax; jj++) fprintf(file," -----------");
        }
        fprintf(file,"\n");

        for(i=ilo; i <ihi+1; i++){
          fprintf(file,"%4ld  ",(long)i);

          lo[0] = i;
          lo[1] = i;
          hi[0] = j;
          hi[1] = jmax;
          switch(type){
            case C_INT:
              pnga_get(g_a, lo, hi, ibuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %8d",ibuf[jj]);
              break;
            case C_LONG: 
              pnga_get(g_a, lo, hi, lbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %8ld",lbuf[jj]);
              break;
            case C_LONGLONG: 
              pnga_get(g_a, lo, hi, llbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %8lld",llbuf[jj]);
              break;
            case C_DBL:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %11.5f",dbuf[jj]);
              break;
            case C_FLOAT:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %11.5f",fbuf[jj]);
              break;     
            case C_DCPL:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj+=2)
                fprintf(file," %11.5f,%11.5f",dbuf[jj], dbuf[jj+1]);
              break;
            case C_SCPL:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj+=2)
                fprintf(file," %11.5f,%11.5f",dbuf[jj], dbuf[jj+1]);
              break;
            default: pnga_error("ga_print: wrong type",0);
          }
          fprintf(file,"\n");
        }
        fflush(file);
      }
    }
  }

  pnga_pgroup_sync(a_grp);
}